

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatSolverCore.c
# Opt level: O2

int Msat_SolverSolve(Msat_Solver_t *p,Msat_IntVec_t *vAssumps,int nBackTrackLimit,int nTimeLimit)

{
  int iVar1;
  uint uVar2;
  Msat_Type_t MVar3;
  abctime aVar4;
  int *piVar5;
  Msat_Clause_t *pMVar6;
  abctime aVar7;
  ulong uVar8;
  ulong uVar9;
  double local_60;
  double local_58;
  Msat_SearchParams_t Params;
  
  Params.dVarDecay = 0.95;
  Params.dClaDecay = 0.999;
  aVar4 = Abc_Clock();
  if (vAssumps == (Msat_IntVec_t *)0x0) {
LAB_0043e28c:
    iVar1 = Msat_SolverReadDecisionLevel(p);
    p->nLevelRoot = iVar1;
    iVar1 = Msat_ClauseVecReadSize(p->vClauses);
    p->nClausesInit = iVar1;
    iVar1 = Msat_ClauseVecReadSize(p->vClauses);
    local_58 = (double)(iVar1 / 3);
    p->nBackTracks = (int)(p->Stats).nConflicts;
    MVar3 = MSAT_UNKNOWN;
    local_60 = 100.0;
    do {
      do {
        if (MVar3 != MSAT_UNKNOWN) goto LAB_0043e39e;
        if (p->fVerbose != 0) {
          printf("Solving -- conflicts=%d   learnts=%d   progress=%.4f %%\n",p->dProgress * 100.0,
                 (ulong)(uint)(int)local_60,(ulong)(uint)(int)local_58);
        }
        MVar3 = Msat_SolverSearch(p,(int)local_60,(int)local_58,nBackTrackLimit,&Params);
        local_60 = local_60 * 1.5;
        local_58 = local_58 * 1.1;
        if ((0 < nBackTrackLimit) && (nBackTrackLimit < (int)(p->Stats).nConflicts - p->nBackTracks)
           ) goto LAB_0043e39e;
      } while (nTimeLimit < 1);
      aVar7 = Abc_Clock();
    } while (aVar7 - aVar4 < (long)((ulong)(uint)nTimeLimit * 1000000));
LAB_0043e39e:
    Msat_SolverCancelUntil(p,0);
    p->nBackTracks = (int)(p->Stats).nConflicts - p->nBackTracks;
  }
  else {
    iVar1 = Msat_IntVecReadSize(p->vTrailLim);
    if (iVar1 != 0) {
      __assert_fail("Msat_IntVecReadSize(p->vTrailLim) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/msat/msatSolverCore.c"
                    ,0x98,"int Msat_SolverSolve(Msat_Solver_t *, Msat_IntVec_t *, int, int)");
    }
    uVar2 = Msat_IntVecReadSize(vAssumps);
    piVar5 = Msat_IntVecReadArray(vAssumps);
    uVar9 = 0;
    uVar8 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar8 = uVar9;
    }
    do {
      if (uVar8 == uVar9) goto LAB_0043e28c;
      iVar1 = Msat_SolverAssume(p,piVar5[uVar9]);
      if (iVar1 == 0) break;
      pMVar6 = Msat_SolverPropagate(p);
      uVar9 = uVar9 + 1;
    } while (pMVar6 == (Msat_Clause_t *)0x0);
    Msat_QueueClear(p->pQueue);
    Msat_SolverCancelUntil(p,0);
    MVar3 = MSAT_FALSE;
  }
  return MVar3;
}

Assistant:

int  Msat_SolverSolve( Msat_Solver_t * p, Msat_IntVec_t * vAssumps, int nBackTrackLimit, int nTimeLimit )
{
    Msat_SearchParams_t Params = { 0.95, 0.999 };
    double nConflictsLimit, nLearnedLimit;
    Msat_Type_t Status;
    abctime timeStart = Abc_Clock();

//    p->pFreq = ABC_ALLOC( int, p->nVarsAlloc );
//    memset( p->pFreq, 0, sizeof(int) * p->nVarsAlloc );
 
    if ( vAssumps )
    {
        int * pAssumps, nAssumps, i;

        assert( Msat_IntVecReadSize(p->vTrailLim) == 0 );

        nAssumps = Msat_IntVecReadSize( vAssumps );
        pAssumps = Msat_IntVecReadArray( vAssumps );
        for ( i = 0; i < nAssumps; i++ )
        {
            if ( !Msat_SolverAssume(p, pAssumps[i]) || Msat_SolverPropagate(p) )
            {
                Msat_QueueClear( p->pQueue );
                Msat_SolverCancelUntil( p, 0 );
                return MSAT_FALSE;
            }
        }
    }
    p->nLevelRoot   = Msat_SolverReadDecisionLevel(p);
    p->nClausesInit = Msat_ClauseVecReadSize( p->vClauses );    
    nConflictsLimit = 100;
    nLearnedLimit   = Msat_ClauseVecReadSize(p->vClauses) / 3;
    Status = MSAT_UNKNOWN;
    p->nBackTracks = (int)p->Stats.nConflicts;
    while ( Status == MSAT_UNKNOWN )
    {
        if ( p->fVerbose )
            printf("Solving -- conflicts=%d   learnts=%d   progress=%.4f %%\n", 
                (int)nConflictsLimit, (int)nLearnedLimit, p->dProgress*100);
        Status = Msat_SolverSearch( p, (int)nConflictsLimit, (int)nLearnedLimit, nBackTrackLimit, &Params );
        nConflictsLimit *= 1.5;
        nLearnedLimit   *= 1.1;
        // if the limit on the number of backtracks is given, quit the restart loop
        if ( nBackTrackLimit > 0 && (int)p->Stats.nConflicts - p->nBackTracks > nBackTrackLimit )
            break;
        // if the runtime limit is exceeded, quit the restart loop
        if ( nTimeLimit > 0 && Abc_Clock() - timeStart >= nTimeLimit * CLOCKS_PER_SEC )
            break;
    }
    Msat_SolverCancelUntil( p, 0 );
    p->nBackTracks = (int)p->Stats.nConflicts - p->nBackTracks;
/*
    ABC_PRT( "True solver runtime", Abc_Clock() - timeStart );
    // print the statistics
    {
        int i, Counter = 0;
        for ( i = 0; i < p->nVars; i++ )
            if ( p->pFreq[i] > 0 )
            {
                printf( "%d ", p->pFreq[i] );
                Counter++;
            }
        if ( Counter )
            printf( "\n" );
        printf( "Total = %d. Used = %d.  Decisions = %d. Imps = %d. Conflicts = %d. ", p->nVars, Counter, (int)p->Stats.nDecisions, (int)p->Stats.nPropagations, (int)p->Stats.nConflicts );
        ABC_PRT( "Time", Abc_Clock() - timeStart );
    }
*/
    return Status;
}